

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O2

shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
 __thiscall
pstore::index::
get_index<(pstore::trailer::indices)4,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
          (index *this,database *db,bool create)

{
  __shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar1;
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  sVar2;
  typed_address<pstore::index::header_block> location;
  shared_ptr<const_pstore::trailer> footer;
  undefined1 local_50 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (__shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2> *)
            ((db->indices_)._M_elems + 4);
  if ((db->indices_)._M_elems[4].
      super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    database::get_footer((database *)(local_50 + 0x18));
    local_50._16_8_ =
         *(undefined8 *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._24_8_ + 0x40))->_M_use_count;
    if ((element_type *)local_50._16_8_ == (element_type *)0x0) {
      if (create) {
        std::
        make_shared<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>,pstore::database_const&>
                  ((database *)local_50);
        goto LAB_00111f6e;
      }
    }
    else {
      std::
      make_shared<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>,pstore::database_const&,pstore::typed_address<pstore::index::header_block>const&>
                ((database *)local_50,(typed_address<pstore::index::header_block> *)db);
LAB_00111f6e:
      std::__shared_ptr<pstore::index::index_base,(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  plVar1 = *(long **)this_00;
  if (create) {
    if (plVar1 == (long *)0x0) goto LAB_00111fca;
  }
  else if (plVar1 == (long *)0x0) goto LAB_00111faf;
  if ((undefined **)*plVar1 == &PTR__hamt_set_0015c908) {
LAB_00111faf:
    sVar2 = std::
            static_pointer_cast<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const,pstore::index::index_base>
                      ((shared_ptr<pstore::index::index_base> *)this);
    sVar2.
    super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
            )sVar2.
             super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
LAB_00111fca:
  assert_failed("(!create && dx.get () == nullptr) || dynamic_cast<Return *> (dx.get ()) != nullptr"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/index_types.hpp"
                ,0x93);
}

Assistant:

std::shared_ptr<Return> get_index (Database & db, bool const create = true) {
            auto & dx = db.get_mutable_index (Index);

            // Have we already loaded this index?
            if (dx.get () == nullptr) {
                std::shared_ptr<trailer const> const footer = db.get_footer ();
                typed_address<index::header_block> const location = footer->a.index_records.at (
                    static_cast<typename std::underlying_type<decltype (Index)>::type> (Index));
                if (location == decltype (location)::null ()) {
                    if (create) {
                        // Create a new (empty) index.
                        dx = std::make_shared<typename std::remove_const<Return>::type> (db);
                    }
                } else {
                    // Construct the index from the location.
                    dx = std::make_shared<typename std::remove_const<Return>::type> (db, location);
                }
            }

#ifdef PSTORE_CPP_RTTI
            PSTORE_ASSERT ((!create && dx.get () == nullptr) ||
                           dynamic_cast<Return *> (dx.get ()) != nullptr);
#endif
            return std::static_pointer_cast<Return> (dx);
        }